

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.hpp
# Opt level: O0

void __thiscall ot::commissioner::Interpreter::Value::~Value(Value *this)

{
  Value *this_local;
  
  std::__cxx11::string::~string((string *)&this->mData);
  Error::~Error(&this->mError);
  return;
}

Assistant:

Value() = default;